

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

uint32_t helper_fmadd_tricore(CPUTriCoreState *env,uint32_t r1,uint32_t r2,uint32_t r3)

{
  float_status *s;
  byte bVar1;
  float32 fVar2;
  float32 fVar3;
  float32 fVar4;
  float32 fVar5;
  float32 fVar6;
  uint uVar7;
  uint uVar8;
  byte flags;
  
  s = &env->fp_status;
  fVar3 = float32_muladd_tricore(r1,r2,r3,0,s);
  bVar1 = (env->fp_status).float_exception_flags;
  flags = bVar1 & 0xbd;
  if (flags == 0) {
    env->PSW_USB_C = 0;
  }
  else {
    fVar2 = fVar3;
    if ((bVar1 & 1) != 0) {
      fVar4 = float32_squash_input_denormal_tricore(r1,s);
      fVar5 = float32_squash_input_denormal_tricore(r2,s);
      fVar6 = float32_squash_input_denormal_tricore(r3,s);
      uVar7 = fVar4 & 0x7fffffff;
      fVar2 = 0x7fc00000;
      if ((((uVar7 < 0x7f800001) &&
           (uVar8 = fVar5 & 0x7fffffff, (fVar6 & 0x7fffffff) < 0x7f800001 && uVar8 < 0x7f800001)) &&
          (fVar2 = 0x7fc00002, uVar7 != 0x7f800000 || uVar8 != 0)) &&
         (((uVar7 != 0 || uVar8 != 0x7f800000 &&
           (fVar2 = fVar3,
           (~fVar6 & 0x7f800000) == 0 && ((~fVar5 & 0x7f800000) == 0 || (~fVar4 & 0x7f800000) == 0))
           ) && ((int)(fVar5 ^ fVar4 ^ fVar6) < 0)))) {
        fVar2 = 0x7fc00001;
      }
    }
    fVar3 = fVar2;
    f_update_psw_flags(env,flags);
  }
  return fVar3;
}

Assistant:

uint32_t helper_fmadd(CPUTriCoreState *env, uint32_t r1,
                      uint32_t r2, uint32_t r3)
{
    uint32_t flags;
    float32 arg1 = make_float32(r1);
    float32 arg2 = make_float32(r2);
    float32 arg3 = make_float32(r3);
    float32 f_result;

    f_result = float32_muladd(arg1, arg2, arg3, 0, &env->fp_status);

    flags = f_get_excp_flags(env);
    if (flags) {
        if (flags & float_flag_invalid) {
            arg1 = float32_squash_input_denormal(arg1, &env->fp_status);
            arg2 = float32_squash_input_denormal(arg2, &env->fp_status);
            arg3 = float32_squash_input_denormal(arg3, &env->fp_status);
            f_result = f_maddsub_nan_result(arg1, arg2, arg3, f_result, 0);
        }
        f_update_psw_flags(env, flags);
    } else {
        env->FPU_FS = 0;
    }
    return (uint32_t)f_result;
}